

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

float Amap_CutAreaDeref(Amap_Man_t *p,Amap_Mat_t *pM)

{
  char cVar1;
  ushort uVar2;
  Amap_Cut_t AVar3;
  Vec_Ptr_t *pVVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  Amap_Cut_t *pAVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  
  uVar2 = *(ushort *)&pM->pSet->field_0x8;
  pVVar4 = p->pLib->vGates;
  if ((int)(uint)uVar2 < pVVar4->nSize) {
    fVar12 = (float)*(double *)((long)pVVar4->pArray[uVar2] + 0x20);
    pAVar7 = pM->pCut;
    if (0x1ffff < (uint)*pAVar7) {
      uVar11 = 0;
      do {
        cVar1 = pM->pSet->Ins[uVar11];
        if ((cVar1 < '\0') || (AVar3 = pAVar7[(ulong)((uint)(int)cVar1 >> 1) + 1], (int)AVar3 < 0))
        {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p->vObjs->nSize <= (int)((uint)AVar3 >> 1)) goto LAB_003b0f09;
        puVar5 = (undefined8 *)p->vObjs->pArray[(uint)AVar3 >> 1];
        iVar9 = *(int *)(puVar5 + 6) + *(int *)((long)puVar5 + 0x2c);
        if (iVar9 == 0 || SCARRY4(*(int *)(puVar5 + 6),*(int *)((long)puVar5 + 0x2c)) != iVar9 < 0)
        {
          __assert_fail("Amap_ObjRefsTotal(pFanin) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                        ,0x11a,"float Amap_CutAreaDeref(Amap_Man_t *, Amap_Mat_t *)");
        }
        uVar8 = (int)cVar1 & 1;
        uVar10 = (uint)AVar3 & 1 ^ uVar8;
        uVar6 = *puVar5;
        iVar9 = *(int *)((long)puVar5 + (ulong)uVar10 * 4 + 0x2c);
        if ((uVar10 != -(int)((long)uVar6 >> 0x3f)) && (iVar9 == 1)) {
          fVar12 = fVar12 + p->fAreaInv;
          iVar9 = 1;
        }
        *(int *)((long)puVar5 + (ulong)uVar10 * 4 + 0x2c) = iVar9 + -1;
        if ((iVar9 + -1 + *(int *)((long)puVar5 + (ulong)(uVar8 == ((uint)AVar3 & 1)) * 4 + 0x2c) ==
             0) && (uVar8 = (uint)uVar6, (uVar8 & 6) == 4 || (uVar8 & 7) == 6)) {
          fVar13 = Amap_CutAreaDeref(p,(Amap_Mat_t *)(puVar5 + 7));
          fVar12 = fVar12 + fVar13;
          pAVar7 = pM->pCut;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (uint)*pAVar7 >> 0x11);
    }
    return fVar12;
  }
LAB_003b0f09:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline float Amap_CutAreaDeref( Amap_Man_t * p, Amap_Mat_t * pM )
{
    Amap_Obj_t * pFanin;
    int i, fCompl;
    float Area = Amap_LibGate( p->pLib, pM->pSet->iGate )->dArea;
    Amap_MatchForEachFaninCompl( p, pM, pFanin, fCompl, i )
    {
        assert( Amap_ObjRefsTotal(pFanin) > 0 );
        if ( (int)pFanin->fPolar != fCompl && pFanin->nFouts[fCompl] == 1 )
            Area += p->fAreaInv;
        if ( --pFanin->nFouts[fCompl] + pFanin->nFouts[!fCompl] == 0 && Amap_ObjIsNode(pFanin) )
            Area += Amap_CutAreaDeref( p, &pFanin->Best );
    }
    return Area;
}